

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ThreadSafeArena::InitializeWithPolicy
          (ThreadSafeArena *this,AllocationPolicy *policy)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  _func_void_void_ptr_size_t *p_Var4;
  bool bVar5;
  Nonnull<const_char_*> pcVar6;
  uint64_t uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong v1;
  long *in_FS_OFFSET;
  void *p;
  size_t *local_30;
  LogMessage local_28;
  
  lVar1 = *in_FS_OFFSET;
  uVar7 = in_FS_OFFSET[-0x10];
  if ((char)uVar7 == '\0') {
    LOCK();
    UNLOCK();
    uVar7 = lifecycle_id_ << 8;
    lifecycle_id_ = lifecycle_id_ + 1;
  }
  in_FS_OFFSET[-0x10] = uVar7 + 1;
  this->tag_and_id_ = uVar7;
  (this->head_)._M_b._M_p = (__pointer_type)kSentryArenaChunk;
  this->first_owner_ = (void *)(lVar1 + -0x80);
  in_FS_OFFSET[-0xe] = (long)&this->first_arena_;
  in_FS_OFFSET[-0xf] = this->tag_and_id_;
  if ((((policy->start_block_size == 0x100) && (policy->max_block_size == 0x8000)) &&
      (policy->block_alloc == (_func_void_ptr_size_t *)0x0)) &&
     (policy->block_dealloc == (_func_void_void_ptr_size_t *)0x0)) {
    return;
  }
  uVar9 = (this->alloc_policy_).policy_;
  bVar5 = SerialArena::MaybeAllocateAligned(&this->first_arena_,0x20,&local_30);
  if (bVar5) {
    sVar2 = policy->start_block_size;
    sVar3 = policy->max_block_size;
    p_Var4 = policy->block_dealloc;
    local_30[2] = (size_t)policy->block_alloc;
    local_30[3] = (size_t)p_Var4;
    *local_30 = sVar2;
    local_30[1] = sVar3;
    if (((ulong)local_30 & 3) == 0) {
      pcVar6 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,unsigned_long>
                         (0,(ulong)local_30 & 3,"0u == reinterpret_cast<uintptr_t>(p) & 3");
    }
    if (pcVar6 == (Nonnull<const_char_*>)0x0) {
      uVar8 = (ulong)((uint)(this->alloc_policy_).policy_ & 7) | (ulong)local_30;
      (this->alloc_policy_).policy_ = uVar8;
      if (uVar9 < 4) {
        return;
      }
      v1 = (ulong)((uint)uVar9 & 3);
      uVar9 = (ulong)((uint)uVar8 & 3);
      if (v1 == uVar9) {
        pcVar6 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                           (v1,uVar9,"old_alloc_policy & 3 == alloc_policy_.get_raw() & 3");
      }
      if (pcVar6 == (Nonnull<const_char_*>)0x0) {
        return;
      }
    }
    else {
      InitializeWithPolicy();
    }
    InitializeWithPolicy();
  }
  else {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena.cc"
               ,0x27d);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&local_28,(char (*) [39])"MaybeAllocateAligned cannot fail here.");
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_28);
}

Assistant:

void ThreadSafeArena::InitializeWithPolicy(const AllocationPolicy& policy) {
  Init();

  if (policy.IsDefault()) return;

#ifndef NDEBUG
  const uint64_t old_alloc_policy = alloc_policy_.get_raw();
  // If there was a policy (e.g., in Reset()), make sure flags were preserved.
#define ABSL_DCHECK_POLICY_FLAGS_() \
  if (old_alloc_policy > 3)         \
  ABSL_CHECK_EQ(old_alloc_policy & 3, alloc_policy_.get_raw() & 3)
#else
#define ABSL_DCHECK_POLICY_FLAGS_()
#endif  // NDEBUG

  // We ensured enough space so this cannot fail.
  void* p;
  if (!first_arena_.MaybeAllocateAligned(kAllocPolicySize, &p)) {
    ABSL_LOG(FATAL) << "MaybeAllocateAligned cannot fail here.";
    return;
  }
  new (p) AllocationPolicy{policy};
  // Low bits store flags, so they mustn't be overwritten.
  ABSL_DCHECK_EQ(0u, reinterpret_cast<uintptr_t>(p) & 3);
  alloc_policy_.set_policy(reinterpret_cast<AllocationPolicy*>(p));
  ABSL_DCHECK_POLICY_FLAGS_();

#undef ABSL_DCHECK_POLICY_FLAGS_
}